

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

int Vec_IntCountUnique(Vec_Int_t *p)

{
  uint uVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  int iVar5;
  size_t __nmemb;
  ulong uVar6;
  
  uVar1 = p->nSize;
  if ((long)(int)uVar1 == 0) {
    __nmemb = 1;
  }
  else {
    iVar5 = *p->pArray;
    for (lVar4 = 1; lVar4 < (int)uVar1; lVar4 = lVar4 + 1) {
      iVar2 = p->pArray[lVar4];
      if (iVar5 <= iVar2) {
        iVar5 = iVar2;
      }
    }
    __nmemb = (size_t)(iVar5 + 1);
  }
  __ptr = calloc(__nmemb,1);
  uVar3 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar3;
  }
  iVar5 = 0;
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    if (*(char *)((long)__ptr + (long)p->pArray[uVar3]) == '\0') {
      *(undefined1 *)((long)__ptr + (long)p->pArray[uVar3]) = 1;
      iVar5 = iVar5 + 1;
    }
  }
  free(__ptr);
  return iVar5;
}

Assistant:

static inline int Vec_IntCountUnique( Vec_Int_t * p )
{
    int i, Count = 0, Max = Vec_IntFindMax(p);
    unsigned char * pPres = ABC_CALLOC( unsigned char, Max+1 );
    for ( i = 0; i < p->nSize; i++ )
        if ( pPres[p->pArray[i]] == 0 )
            pPres[p->pArray[i]] = 1, Count++;
    ABC_FREE( pPres );
    return Count;
}